

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::trainThread(FastText *this,int32_t threadId,TrainCallback *callback)

{
  bool bVar1;
  undefined4 uVar2;
  element_type *peVar3;
  minstd_rand *rng;
  vector<int,_std::allocator<int>_> *words;
  long lVar4;
  int64_t iVar5;
  element_type *this_00;
  int64_t iVar6;
  __int_type_conflict _Var7;
  ulong uVar8;
  ulong uVar9;
  FastText *in_RDX;
  int in_ESI;
  FastText *in_RDI;
  float fVar10;
  float fVar11;
  EncounteredNaNError *anon_var_0;
  real lr;
  int64_t eta;
  double lr_1;
  double wst;
  real progress;
  uint64_t callbackCounter;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  State state;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  real in_stack_fffffffffffffc54;
  Matrix *in_stack_fffffffffffffc58;
  int32_t in_stack_fffffffffffffc60;
  int32_t in_stack_fffffffffffffc64;
  float in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  real in_stack_fffffffffffffc74;
  State *in_stack_fffffffffffffc78;
  FastText *in_stack_fffffffffffffc80;
  float in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc98;
  int iVar12;
  int iVar13;
  istream *in_stack_fffffffffffffcd8;
  Dictionary *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  real in_stack_fffffffffffffcf4;
  State *in_stack_fffffffffffffcf8;
  FastText *in_stack_fffffffffffffd00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd20;
  istream *in_stack_fffffffffffffd28;
  minstd_rand in_stack_fffffffffffffd30;
  ulong local_2c0;
  Matrix *local_288;
  State local_278;
  undefined1 local_220 [520];
  FastText *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bd140);
  std::ifstream::ifstream(local_220,(string *)&peVar3->input,_S_in);
  rng = (minstd_rand *)(long)local_c;
  words = (vector<int,_std::allocator<int>_> *)
          utils::size((ifstream *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  lVar4 = (long)rng * (long)words;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bd1a5);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
              (int64_t)in_stack_fffffffffffffc58);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bd1d5);
  iVar13 = peVar3->dim;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bd1ed);
  iVar5 = Matrix::size(in_stack_fffffffffffffc58,
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  uVar2 = (undefined4)iVar5;
  iVar12 = local_c;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bd21e);
  Model::State::State((State *)in_stack_fffffffffffffc80,
                      (int32_t)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                      (int32_t)in_stack_fffffffffffffc78,(int32_t)in_stack_fffffffffffffc74);
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bd24f);
  iVar6 = Dictionary::ntokens(this_00);
  local_288 = (Matrix *)0x0;
  iVar5 = iVar6;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bd284);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bd291);
  local_2c0 = 0;
  while (bVar1 = keepTraining((FastText *)
                              CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                              (int64_t)in_stack_fffffffffffffc58), bVar1) {
    _Var7 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)in_stack_fffffffffffffc58);
    fVar10 = (float)_Var7;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd2db);
    fVar11 = fVar10 / (float)(peVar3->epoch * iVar6);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(float,_float,_double,_double,_long)> *)
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    if ((bVar1) && (uVar9 = local_2c0 + 1, uVar8 = local_2c0 & 0x3f, local_2c0 = uVar9, uVar8 == 0))
    {
      progressInfo(in_RDI,(real)((ulong)lVar4 >> 0x20));
      in_stack_fffffffffffffc78 = (State *)&stack0xfffffffffffffcf0;
      std::tie<double,double,long>
                ((double *)in_stack_fffffffffffffc58,
                 (double *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (long *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::tuple<double&,double&,long&>::operator=
                ((tuple<double_&,_double_&,_long_&> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (tuple<long,_double,_double> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      in_stack_fffffffffffffc80 = local_18;
      in_stack_fffffffffffffc88 = fVar11;
      std::atomic::operator_cast_to_float((atomic<float> *)0x1bd3c1);
      std::function<void_(float,_float,_double,_double,_long)>::operator()
                ((function<void_(float,_float,_double,_double,_long)> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68,
                 (double)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (double)in_stack_fffffffffffffc58,
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    }
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd4e3);
    fVar11 = (float)(peVar3->lr * (1.0 - (double)fVar11));
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd51c);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1bd537);
      in_stack_fffffffffffffc68 =
           (float)Dictionary::getLine((Dictionary *)in_stack_fffffffffffffd30._M_x,
                                      in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                                      in_stack_fffffffffffffd18);
      local_288 = (Matrix *)((long)&local_288->_vptr_Matrix + (long)(int)in_stack_fffffffffffffc68);
      supervised(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    }
    else {
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bd5b3);
      if (peVar3->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1bd5ca);
        in_stack_fffffffffffffc64 =
             Dictionary::getLine(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,words,rng);
        local_288 = (Matrix *)((long)&local_288->_vptr_Matrix + (long)in_stack_fffffffffffffc64);
        cbow(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
             (vector<int,_std::allocator<int>_> *)CONCAT44(fVar11,in_stack_fffffffffffffce8));
      }
      else {
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bd63e);
        if (peVar3->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1bd655);
          in_stack_fffffffffffffc60 =
               Dictionary::getLine(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,words,rng);
          local_288 = (Matrix *)((long)&local_288->_vptr_Matrix + (long)in_stack_fffffffffffffc60);
          skipgram((FastText *)CONCAT44(iVar13,uVar2),
                   (State *)CONCAT44(iVar12,in_stack_fffffffffffffc98),(real)((ulong)iVar5 >> 0x20),
                   (vector<int,_std::allocator<int>_> *)CONCAT44(fVar10,in_stack_fffffffffffffc88));
        }
      }
    }
    in_stack_fffffffffffffc58 = local_288;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bd6d7);
    if ((long)peVar3->lrUpdateRate < (long)in_stack_fffffffffffffc58) {
      std::__atomic_base<long>::operator+=
                (&(in_RDI->tokenCount_).super___atomic_base<long>,(__int_type_conflict)local_288);
      local_288 = (Matrix *)0x0;
      if ((local_c == 0) &&
         (peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bd721), 1 < peVar3->verbose)) {
        in_stack_fffffffffffffc54 = Model::State::getLoss(&local_278);
        std::atomic<float>::operator=
                  ((atomic<float> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc4c);
      }
    }
  }
  if (local_c == 0) {
    Model::State::getLoss(&local_278);
    std::atomic<float>::operator=
              ((atomic<float> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc4c);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Model::State::~State((State *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId, const TrainCallback& callback) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  uint64_t callbackCounter = 0;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      if (callback && ((callbackCounter++ % 64) == 0)) {
        double wst;
        double lr;
        int64_t eta;
        std::tie<double, double, int64_t>(wst, lr, eta) =
            progressInfo(progress);
        callback(progress, loss_, wst, lr, eta);
      }
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}